

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *p_Var5;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *p_Var6;
  uint uVar7;
  unsigned_long result;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *p_Var8;
  size_t i;
  long lVar9;
  ulong uVar10;
  initializer_list<int> __l;
  timer tm;
  uint local_ec;
  int v_1;
  undefined4 uStack_e4;
  pointer piStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *p_Stack_c0;
  long local_b8;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  *local_b0;
  byte local_a8;
  vector<int,_std::allocator<int>_> v;
  _Vector_base<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> tv;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Hamming distance: ");
  std::__cxx11::string::string((string *)&v_1,"ACCAGGG",(allocator *)&tv);
  std::__cxx11::string::string((string *)&v,"ACTATGG",(allocator *)&local_78);
  iVar3 = hamming((string *)&v_1,(string *)&v);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::string::~string((string *)&v_1);
  local_c8 = 0x4c00000043;
  p_Stack_c0 = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
                *)0x31500000043;
  local_d8._M_allocated_capacity = 0x3800000021;
  local_d8._8_8_ = 0x2d0000002c;
  _v_1 = (pointer)0x300000001;
  piStack_e0 = (pointer)0x4300000005;
  __l._M_len = 0xc;
  __l._M_array = &v_1;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&tv);
  for (lVar9 = 0; lVar9 != 0x28; lVar9 = lVar9 + 4) {
    uVar7 = *(int *)((long)&DAT_001030c8 + lVar9) * *(int *)((long)&DAT_001030c8 + lVar9);
    if (5 < uVar7) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
      std::operator<<(poVar4," ");
    }
  }
  tm._start_time = clock();
  tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (uVar10 = 0; uVar10 != 100000000; uVar10 = uVar10 + 1) {
    uVar7 = (int)uVar10 * (int)uVar10;
    v_1 = uVar7;
    if ((uVar7 & 1) != 0 && uVar10 < 50000000) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)&tv,&v_1);
    }
  }
  std::operator<<((ostream *)&std::cout,"\n------\n");
  std::operator<<((ostream *)&std::cout,"Raw: ");
  dVar1 = boost::timer::elapsed(&tm);
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cout,"------\n");
  tm._start_time = clock();
  local_d8._M_allocated_capacity = 0;
  _v_1 = (pointer)0x0;
  piStack_e0 = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._8_4_ = 50000000;
  local_c8 = 0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Stack_c0 = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
                *)0x5f5e100;
  local_b8 = 1;
  local_b0 = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0;
  local_a8 = 0;
  p_Var5 = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
            *)0x5f5e100;
  bVar2 = 0;
  while( true ) {
    p_Var8 = local_b0;
    p_Var6 = p_Var5;
    if ((bVar2 & 1) != 0) {
      p_Var8 = p_Var5;
      p_Var6 = local_b0;
    }
    if (p_Var6 <= p_Var8) break;
    p_Var6 = (_Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
              *)((long)&(local_b0->_result).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_b8);
    local_ec = (int)local_b0 * (int)local_b0;
    local_b0 = p_Var6;
    if ((local_ec & 1) != 0) {
      if (local_d8._8_4_ == 0) {
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&v_1,(int *)&local_ec);
        p_Var5 = p_Stack_c0;
        bVar2 = local_a8;
      }
      else {
        local_d8._8_4_ = local_d8._8_4_ + -1;
      }
    }
  }
  Return<std::vector<int,std::allocator<int>>>::
  get<_Into<std::vector<int,std::allocator<int>>,BackInserter<std::vector<int,std::allocator<int>>>>>
            ((vector<int,_std::allocator<int>_> *)&local_38,
             (Return<std::vector<int,std::allocator<int>>> *)&v_1,p_Var6);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v_1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::operator<<((ostream *)&std::cout,"blue-fnc: ");
  dVar1 = boost::timer::elapsed(&tm);
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar4,"\n");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tv.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(void)
{
  std::cout << "Hamming distance: " << hamming("ACCAGGG", "ACTATGG") << std::endl;

  std::vector<int> v = {1,3,5,67,33,56,44,45,67,76,67,789};

  Functions fnc;

  fnc(   from({9,8,7,6,5,4,3,2,1,0})
     ,   map([](int i){ return i*i;})
     ,   filter(_ > 5)
     ,   foreach([](int i){std::cout << i << " ";})
     );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Filter([](int i) {return (i % 2) == 0;})
    //  ,   Take(20)
    //  ,   Map([](int i){return i+i;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range()
    //  ,   Zip(From(v))
    //  ,   Zip(Range(100))
    //  ,   ForEach([](std::tuple<int, int, int>&& v){std::cout << std::get<0>(v) << ":" << std::get<1>(v) << ":" << std::get<2>(v) << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::value)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::x)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Drop(998)
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    //  std::cout << "------\n";
    //  _(   Range(10, 0)
    //   ,   Take(14)
    //   ,   ForEach([](int i){std::cout << i << "\n";})
    //   );
    //
    // std::cout << "------\n";
    // int sum = _(   Range(5)
    //            ,   Reduce(0, [](int a, int b){ return a + b;})
    //            );
    // std::cout << "Sum is: " << sum << "\n";
    // std::cout << "------\n";

    size_t perfCount = 100000000;

    boost::timer tm;

    std::vector<int> tv;
    int c = 0;
    for(size_t i = 0; i < perfCount; ++i)
    {
        int v = i * i;
        if(i < perfCount/2 && v%2)
        {
            tv.emplace_back(v);
        }
        ++c;
    };
    std::cout << "\n------\n";
    std::cout << "Raw: " << tm.elapsed() << "\n";

    std::cout << "------\n";

    tm.restart();

    fnc( range(perfCount)
        , map([](int i) {return i * i;})
        , filter([](int i){ return i % 2;})
        , drop(perfCount/2)
        , into<std::vector<int>>()
        );

    std::cout << "blue-fnc: " << tm.elapsed() << "\n";

    // auto sample = []()
    // {
    //     double x = (double)rand() / RAND_MAX;
    //     double y = (double)rand() / RAND_MAX;
    //     return (x*x + y*y) < 1 ? 1 : 0;
    // };
    //
    // const int numSamples = 1000000;
    // auto count = _( Range(numSamples)
    //               , Map([sample](int){ return sample();})
    //               , Reduce(0, [](int a, int b){ return a + b;})
    //               );
    //
    // std::cout << "Pi: " << 4.0 * (double) count / (double) numSamples << "\n";

    return EXIT_SUCCESS;
}